

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

Process * asl::Process::execute
                    (Process *__return_storage_ptr__,String *command,Array<asl::String> *args)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  byte bVar4;
  Process *pPVar5;
  long n;
  char buffer [8000];
  int local_1f80 [2];
  char local_1f78 [8008];
  
  Process(__return_storage_ptr__);
  run(__return_storage_ptr__,command,args);
  while (pPVar5 = __return_storage_ptr__, bVar1 = finished(__return_storage_ptr__), !bVar1) {
    sleep((uint)pPVar5);
    bVar4 = __return_storage_ptr__->_ready;
    if ((bool)bVar4 == true) {
      iVar2 = ioctl(__return_storage_ptr__->_stdout,0x541b,local_1f80);
      bVar4 = __return_storage_ptr__->_ready;
      if ((iVar2 == 0) && (0 < local_1f80[0])) {
        iVar2 = 0;
        if ((bVar4 & 1) != 0) {
          sVar3 = read(__return_storage_ptr__->_stdout,local_1f78,8000);
          iVar2 = (int)sVar3;
        }
        String::append(&__return_storage_ptr__->_output,local_1f78,iVar2);
        bVar4 = __return_storage_ptr__->_ready;
      }
    }
    if ((((bVar4 & 1) != 0) &&
        (iVar2 = ioctl(__return_storage_ptr__->_stderr,0x541b,local_1f80), iVar2 == 0)) &&
       (0 < local_1f80[0])) {
      iVar2 = 0;
      if (__return_storage_ptr__->_ready == true) {
        sVar3 = read(__return_storage_ptr__->_stderr,local_1f78,8000);
        iVar2 = (int)sVar3;
      }
      String::append(&__return_storage_ptr__->_errors,local_1f78,iVar2);
    }
  }
  while (__return_storage_ptr__->_ready == true) {
    sVar3 = read(__return_storage_ptr__->_stdout,local_1f78,8000);
    if ((int)sVar3 < 1) break;
    String::append(&__return_storage_ptr__->_output,local_1f78,(int)sVar3);
  }
  while( true ) {
    if (__return_storage_ptr__->_ready != true) {
      return __return_storage_ptr__;
    }
    sVar3 = read(__return_storage_ptr__->_stderr,local_1f78,8000);
    if ((int)sVar3 < 1) break;
    String::append(&__return_storage_ptr__->_errors,local_1f78,(int)sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Process Process::execute(const String& command, const Array<String>& args)
{
	Process p;
	p.run(command, args);
	int n, i = 0;
	char buffer[8000];
	while (p.running())
	{
		sleep((i++)%16 == 0 ? 0.001 : 0);
		if (p.outputAvailable() > 0)
		{
			n = p.readOutput(buffer, sizeof(buffer));
			p._output.append(buffer, n);
		}
		if (p.errorsAvailable() > 0)
		{
			n = p.readErrors(buffer, sizeof(buffer));
			p._errors.append(buffer, n);
		}
	}
	while (n = p.readOutput(buffer, sizeof(buffer)), n > 0)
		p._output.append(buffer, n);
	while (n = p.readErrors(buffer, sizeof(buffer)), n > 0)
		p._errors.append(buffer, n);
	p._exitstat = p.exitStatus();
	return p;
}